

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nondaemon.cpp
# Opt level: O0

void ev_handler(mg_connection *nc,int ev,void *ev_data)

{
  http_message *hm;
  void *ev_data_local;
  int ev_local;
  mg_connection *nc_local;
  
  if (ev != 100) {
    mg_printf(nc,"HTTP/1.0 200 OK\r\nContent-Length: 2\r\nContent-Type: text/html\r\n\r\nNo");
  }
  return;
}

Assistant:

static void ev_handler(struct mg_connection *nc, int ev, void *ev_data) {
    struct http_message *hm = (struct http_message *) ev_data;
    switch (ev) {
        case MG_EV_HTTP_REQUEST:

            break;
        default:
            mg_printf(nc, "HTTP/1.0 200 OK\r\n"
                    "Content-Length: 2\r\n"
                    "Content-Type: text/html\r\n\r\nNo");
            break;
    }
}